

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLogLin>
               (GetterXsYs<int> *getter1,GetterXsYRef<int> *getter2,TransformerLogLin *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  double dVar7;
  double dVar8;
  ImPlotContext *pIVar9;
  ImPlotContext *pIVar10;
  long lVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_78;
  int local_6c;
  ImDrawList *local_68;
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  GetterXsYRef<int> *local_50;
  TransformerLogLin *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  local_68 = DrawList;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLogLin>>
              ((LineSegmentsRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLin>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    local_60 = GImPlot;
    local_6c = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_6c = getter1->Count;
    }
    if (0 < local_6c) {
      iVar12 = 0;
      do {
        pIVar9 = GImPlot;
        iVar4 = getter1->Count;
        lVar11 = (long)(((getter1->Offset + iVar12) % iVar4 + iVar4) % iVar4) *
                 (long)getter1->Stride;
        iVar4 = *(int *)((long)getter1->Ys + lVar11);
        dVar7 = log10((double)*(int *)((long)getter1->Xs + lVar11) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar10 = GImPlot;
        pIVar6 = pIVar9->CurrentPlot;
        dVar3 = (pIVar6->XAxis).Range.Min;
        iVar5 = transformer->YAxis;
        local_58._4_4_ =
             (float)(((double)iVar4 - pIVar6->YAxis[iVar5].Range.Min) * pIVar9->My[iVar5] +
                    (double)pIVar9->PixelRange[iVar5].Min.y);
        local_58._0_4_ =
             (float)((((double)(float)(dVar7 / pIVar9->LogDenX) *
                       ((pIVar6->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar9->Mx +
                    (double)pIVar9->PixelRange[iVar5].Min.x);
        iVar4 = getter2->Count;
        dVar3 = getter2->YRef;
        dVar8 = log10((double)*(int *)((long)getter2->Xs +
                                      (long)(((getter2->Offset + iVar12) % iVar4 + iVar4) % iVar4) *
                                      (long)getter2->Stride) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar6 = pIVar10->CurrentPlot;
        dVar7 = (pIVar6->XAxis).Range.Min;
        iVar4 = transformer->YAxis;
        fVar13 = (float)((((double)(float)(dVar8 / pIVar10->LogDenX) *
                           ((pIVar6->XAxis).Range.Max - dVar7) + dVar7) - dVar7) * pIVar10->Mx +
                        (double)pIVar10->PixelRange[iVar4].Min.x);
        fVar14 = (float)((dVar3 - pIVar6->YAxis[iVar4].Range.Min) * pIVar10->My[iVar4] +
                        (double)pIVar10->PixelRange[iVar4].Min.y);
        local_78.y = fVar14;
        local_78.x = fVar13;
        pIVar6 = local_60->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar14 <= (float)local_58._4_4_) {
          fVar2 = fVar14;
        }
        if ((fVar2 < (pIVar6->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar14 <= (float)local_58._4_4_) & (uint)fVar14 |
                           local_58._4_4_ & -(uint)(fVar14 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (fVar13 <= (float)local_58._0_4_) {
            fVar2 = fVar13;
          }
          if ((fVar2 < (pIVar6->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(fVar13 <= (float)local_58._0_4_) & (uint)fVar13 |
                             local_58._0_4_ & -(uint)(fVar13 <= (float)local_58._0_4_)),
             (pIVar6->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_68,(ImVec2 *)local_58,&local_78,col,line_weight);
          }
        }
        iVar12 = iVar12 + 1;
      } while (local_6c != iVar12);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}